

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall JSONTest_Stringify_Test::JSONTest_Stringify_Test(JSONTest_Stringify_Test *this)

{
  testing::Test::Test(&this->super_JSONTest);
  (this->super_JSONTest)._vptr_Test = (_func_int **)&PTR__Test_002ba848;
  return;
}

Assistant:

TEST_F(JSONTest, Stringify) {
  // TODO: change the API to not require a copy
  auto input = "[\"hello\",\"world\"]";
  auto* copy = strdup(input);
  json::Value value;
  value.parse(copy, json::Value::ASCII);
  std::stringstream ss;
  value.stringify(ss);
  EXPECT_EQ(ss.str(), input);
  free(copy);
}